

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O3

bool __thiscall GetNameTest::DoTest(GetNameTest *this)

{
  size_t sVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  FILE *pFVar4;
  size_t __n;
  DnsStats *this_00;
  char **ppcVar5;
  ulong uVar6;
  size_t name_length;
  char name_out [1024];
  size_t local_440;
  uint8_t local_438 [1032];
  
  pFVar4 = ithi_file_open("getname-out.txt","w");
  this->test_out = pFVar4;
  bVar2 = false;
  if (pFVar4 != (FILE *)0x0) {
    bVar2 = true;
    ppcVar5 = &getNameTestData[0].expected;
    uVar6 = 0;
    do {
      local_440 = 0;
      sVar1 = (size_t)ppcVar5[-1];
      iVar3 = DnsStats::GetDnsName
                        (((st_getNameTestLine *)(ppcVar5 + -2))->dns,(uint32_t)sVar1,0,local_438,
                         0x400,&local_440);
      if (sVar1 != (long)iVar3) {
LAB_0017c87a:
        bVar2 = false;
        goto LAB_0017c880;
      }
      __s = *ppcVar5;
      __n = strlen(__s);
      if (__n != local_440) goto LAB_0017c87a;
      iVar3 = bcmp(__s,local_438,__n);
      if (iVar3 != 0) {
        bVar2 = false;
      }
      if (7 < uVar6) break;
      uVar6 = uVar6 + 1;
      ppcVar5 = ppcVar5 + 3;
    } while (bVar2 != false);
    if (bVar2 != false) {
      this_00 = (DnsStats *)operator_new(0x1e0);
      DnsStats::DnsStats(this_00);
      this->stats = this_00;
      bVar2 = LoadPcapFile(this,"data/tiny-capture.pcap");
    }
LAB_0017c880:
    if ((FILE *)this->test_out != (FILE *)0x0) {
      fclose((FILE *)this->test_out);
      this->test_out = (FILE *)0x0;
    }
    if (bVar2 == false) {
      bVar2 = false;
    }
    else {
      bVar2 = MetricTest::compare_files("getname-out.txt","data/getname-test.txt");
    }
  }
  return bVar2;
}

Assistant:

bool GetNameTest::DoTest()
{
    bool ret = true;

    test_out = ithi_file_open(getname_test_debug, "w");
    ret = (test_out != NULL);

    for (size_t i = 0; ret && i < sizeof(getNameTestData) / sizeof(struct st_getNameTestLine); i++) {
        char name_out[1024];
        size_t name_length = 0;
        size_t next = 0;

        next = DnsStats::GetDnsName(getNameTestData[i].dns, (uint32_t)getNameTestData[i].dns_length, 0, (uint8_t *)name_out, sizeof(name_out), &name_length);

        if (next != getNameTestData[i].dns_length) {
            ret = false;
        } else  if (strlen(getNameTestData[i].expected) != name_length) {
            ret = false;
        } else if (memcmp(getNameTestData[i].expected, name_out, name_length) != 0) {
            ret = false;
        }
    }


    if (ret) {
        stats = new DnsStats();

        if (stats == NULL) {
            ret = false;
        }
    }

    if (ret) {
        ret = LoadPcapFile(getname_input_test);
    }

    if (test_out != NULL) {
        fclose(test_out);
        test_out = NULL;
    }

    if (ret) {
        ret = MetricTest::compare_files(getname_test_debug, getname_test_output);
    }

    return ret;
}